

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectProgramResourceiv
          (FunctionalTest3_4 *this,GLuint program_id,GLchar **subroutine_names,
          GLchar **uniform_names)

{
  GLint GVar1;
  char *__s;
  code *pcVar2;
  GLuint GVar3;
  bool bVar4;
  int iVar5;
  deUint32 err;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  size_t sVar7;
  reference pvVar8;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar9;
  int local_23c;
  undefined1 local_238 [4];
  GLint i_2;
  MessageBuilder message;
  GLint i_1;
  undefined4 local_a8;
  int local_a4;
  GLenum prop;
  GLint index_sum;
  vector<int,_std::allocator<int>_> compatible_subroutines;
  GLuint index;
  GLuint i;
  GLint location;
  GLint length_1;
  GLchar *uniform_name;
  GLint uniform;
  GLuint n_details;
  inspectionDetails details [4];
  GLint length;
  GLchar *subroutine_name;
  GLint subroutine;
  bool result;
  Functions *gl;
  GLchar **uniform_names_local;
  GLchar **subroutine_names_local;
  GLuint program_id_local;
  FunctionalTest3_4 *this_local;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar6->_vptr_RenderContext[3])();
  subroutine_name._7_1_ = true;
  for (subroutine_name._0_4_ = 0; (int)subroutine_name < this->m_n_active_subroutines;
      subroutine_name._0_4_ = (int)subroutine_name + 1) {
    __s = subroutine_names[(int)subroutine_name];
    sVar7 = strlen(__s);
    details[3].expected_value = (int)sVar7 + 1;
    bVar4 = checkProgramResourceiv(this,program_id,0x92e8,0x92f9,__s,details[3].expected_value);
    if (!bVar4) {
      subroutine_name._7_1_ = false;
    }
  }
  uniform = 0x92f9;
  n_details = 0;
  details[0].pname = 0x92fb;
  details[0].expected_value = 1;
  details[1].pname = 0x8e4a;
  details[1].expected_value = this->m_n_active_subroutines;
  details[2].pname = 0x930e;
  details[2].expected_value = 0;
  uniform_name._4_4_ = 4;
  for (uniform_name._0_4_ = 0; (int)uniform_name < this->m_n_active_subroutine_uniforms;
      uniform_name._0_4_ = (int)uniform_name + 1) {
    _location = uniform_names[(int)uniform_name];
    sVar7 = strlen(_location);
    details[2].expected_value = getSubroutineUniformLocation(this,program_id,_location,true);
    n_details = (int)sVar7 + 1;
    for (compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ < 4;
        compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      bVar4 = checkProgramResourceiv
                        (this,program_id,0x92ee,
                         (&uniform)
                         [(ulong)compatible_subroutines.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_ * 2],_location,
                         details[(ulong)compatible_subroutines.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage._4_4_ - 1].
                         expected_value);
      if (!bVar4) {
        subroutine_name._7_1_ = false;
      }
    }
    compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         getProgramResourceIndex(this,program_id,0x92ee,_location);
    if ((GLuint)compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage != 0xffffffff) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&prop);
      local_a4 = 0;
      local_a8 = 0x8e4b;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&prop,(long)this->m_n_active_subroutines);
      GVar3 = (GLuint)compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
      pcVar2 = *(code **)(CONCAT44(extraout_var,iVar5) + 0x9c8);
      GVar1 = this->m_n_active_subroutines;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&prop,0);
      (*pcVar2)(program_id,0x92ee,GVar3,1,&local_a8,GVar1,0,pvVar8);
      err = (**(code **)(CONCAT44(extraout_var,iVar5) + 0x800))();
      glu::checkError(err,"GetProgramResourceiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0xd47);
      for (message.m_str._368_4_ = 0; (int)message.m_str._368_4_ < this->m_n_active_subroutines;
          message.m_str._368_4_ = message.m_str._368_4_ + 1) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&prop,
                            (long)(int)message.m_str._368_4_);
        local_a4 = *pvVar8 + local_a4;
      }
      if (((this->m_n_active_subroutines + -1) * this->m_n_active_subroutines) / 2 != local_a4) {
        this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        this_01 = tcu::TestContext::getLog(this_00);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_238,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_238,
                            (char (*) [56])"Error. Invalid result. Function: getProgramResourceiv. "
                           );
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(char (*) [50])
                                   "Program interface: GL_VERTEX_SUBROUTINE_UNIFORM. ");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [16])"Resource name: ");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char **)&location);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2b17bfb);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(char (*) [38])"Property: GL_COMPATIBLE_SUBROUTINES. ");
        tcu::MessageBuilder::operator<<(pMVar9,(char (*) [10])0x2a19993);
        for (local_23c = 1; local_23c < this->m_n_active_subroutines; local_23c = local_23c + 1) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&prop,(long)local_23c);
          tcu::MessageBuilder::operator<<((MessageBuilder *)local_238,pvVar8);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_238,(EndMessageToken *)&tcu::TestLog::EndMessage);
        subroutine_name._7_1_ = false;
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_238);
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&prop);
    }
  }
  return subroutine_name._7_1_;
}

Assistant:

bool FunctionalTest3_4::inspectProgramResourceiv(GLuint program_id, const GLchar** subroutine_names,
												 const GLchar** uniform_names) const
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	for (GLint subroutine = 0; subroutine < m_n_active_subroutines; ++subroutine)
	{
		const GLchar* subroutine_name = subroutine_names[subroutine];
		const GLint   length		  = (GLint)strlen(subroutine_name) + 1;

		if (false == checkProgramResourceiv(program_id, GL_VERTEX_SUBROUTINE, GL_NAME_LENGTH, subroutine_name, length))
		{
			result = false;
		}
	}

	inspectionDetails details[] = {
		{ GL_NAME_LENGTH, 0 },
		{ GL_ARRAY_SIZE, 1 },
		{ GL_NUM_COMPATIBLE_SUBROUTINES, m_n_active_subroutines },
		{ GL_LOCATION, 0 },
	};
	const GLuint n_details = sizeof(details) / sizeof(details[0]);

	for (GLint uniform = 0; uniform < m_n_active_subroutine_uniforms; ++uniform)
	{
		const GLchar* uniform_name = uniform_names[uniform];
		const GLint   length	   = (GLint)strlen(uniform_name) + 1;
		const GLint   location	 = getSubroutineUniformLocation(program_id, uniform_name, true);

		details[0].expected_value = length;
		details[3].expected_value = location;

		for (GLuint i = 0; i < n_details; ++i)
		{
			if (false == checkProgramResourceiv(program_id, GL_VERTEX_SUBROUTINE_UNIFORM, details[i].pname,
												uniform_name, details[i].expected_value))
			{
				result = false;
			}
		}

		/* Check compatible subroutines */
		GLuint index = getProgramResourceIndex(program_id, GL_VERTEX_SUBROUTINE_UNIFORM, uniform_name);

		if (GL_INVALID_INDEX != index)
		{
			std::vector<GLint> compatible_subroutines;
			GLint			   index_sum = 0;
			GLenum			   prop		 = GL_COMPATIBLE_SUBROUTINES;

			compatible_subroutines.resize(m_n_active_subroutines);

			gl.getProgramResourceiv(program_id, GL_VERTEX_SUBROUTINE_UNIFORM, index, 1, &prop, m_n_active_subroutines,
									0, &compatible_subroutines[0]);

			GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramResourceiv");

			/* Expected indices are 0, 1, 2, ... N */
			for (GLint i = 0; i < m_n_active_subroutines; ++i)
			{
				index_sum += compatible_subroutines[i];
			}

			/* Sum of E1, ..., EN = (E1 + EN) * N / 2 */
			if (((m_n_active_subroutines - 1) * m_n_active_subroutines) / 2 != index_sum)
			{
				tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

				message << "Error. Invalid result. Function: getProgramResourceiv. "
						<< "Program interface: GL_VERTEX_SUBROUTINE_UNIFORM. "
						<< "Resource name: " << uniform_name << ". "
						<< "Property: GL_COMPATIBLE_SUBROUTINES. "
						<< "Results: ";

				for (GLint i = 1; i < m_n_active_subroutines; ++i)
				{
					message << compatible_subroutines[i];
				}

				message << tcu::TestLog::EndMessage;

				result = false;
			}
		}
	}

	return result;
}